

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecIso.c
# Opt level: O1

void Cec_ManTransformClasses(Gia_Man_t *p)

{
  uint uVar1;
  long lVar2;
  
  if (((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) && (p->pIso != (int *)0x0)) {
    memset(p->pReprs,0,(long)p->nObjs << 2);
    memset(p->pNexts,0,(long)p->nObjs << 2);
    if (0 < p->nObjs) {
      lVar2 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return;
        }
        p->pReprs[lVar2] = (Gia_Rpr_t)((uint)p->pReprs[lVar2] | 0xfffffff);
        uVar1 = p->pIso[lVar2];
        if ((int)uVar1 < lVar2 && (long)(int)uVar1 != 0) {
          p->pReprs[lVar2] = (Gia_Rpr_t)((uint)p->pReprs[lVar2] & 0xf0000000 | uVar1 & 0xfffffff);
          p->pNexts[p->pIso[lVar2]] = (int)lVar2;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < p->nObjs);
    }
    return;
  }
  __assert_fail("p->pReprs && p->pNexts && p->pIso",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecIso.c"
                ,0x110,"void Cec_ManTransformClasses(Gia_Man_t *)");
}

Assistant:

void Cec_ManTransformClasses( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs && p->pNexts && p->pIso );
    memset( p->pReprs, 0, sizeof(int) * Gia_ManObjNum(p) );
    memset( p->pNexts, 0, sizeof(int) * Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        p->pReprs[i].iRepr = GIA_VOID;
        if ( p->pIso[i] && p->pIso[i] < i )
        {
            p->pReprs[i].iRepr = p->pIso[i];
            p->pNexts[p->pIso[i]] = i;
        }
    }
}